

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arc.cpp
# Opt level: O2

bool __thiscall ON_Arc::Create(ON_Arc *this,ON_Circle *circle,ON_Interval angle_interval_in_radians)

{
  ON_Interval *this_00;
  bool bVar1;
  long lVar2;
  ON_Circle *pOVar3;
  ON_Arc *pOVar4;
  double dVar5;
  
  pOVar3 = circle;
  pOVar4 = this;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pOVar4->super_ON_Circle).plane.origin.x = (pOVar3->plane).origin.x;
    pOVar3 = (ON_Circle *)&(pOVar3->plane).origin.y;
    pOVar4 = (ON_Arc *)&(pOVar4->super_ON_Circle).plane.origin.y;
  }
  ON_Plane::UpdateEquation((ON_Plane *)this);
  (this->super_ON_Circle).radius = circle->radius;
  this_00 = &this->m_angle;
  (this->m_angle).m_t[0] = angle_interval_in_radians.m_t[0];
  (this->m_angle).m_t[1] = angle_interval_in_radians.m_t[1];
  bVar1 = ON_Interval::IsDecreasing(this_00);
  bVar1 = !bVar1;
  if (!bVar1) {
    ON_Interval::Swap(this_00);
    Reverse(this);
  }
  dVar5 = ON_Interval::Length(this_00);
  if (dVar5 <= 6.283185307179586) {
    if (bVar1) {
      bVar1 = IsValid(this);
    }
  }
  else {
    (this->m_angle).m_t[1] = (this->m_angle).m_t[0] + 6.283185307179586;
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_Arc::Create(
  const ON_Circle& circle,
  ON_Interval angle_interval_in_radians
  )
{
  bool rc = true;
  plane = circle.plane;
  plane.UpdateEquation();
  radius = circle.radius;
  m_angle = angle_interval_in_radians;
  if ( m_angle.IsDecreasing() )
  {
    rc = false; // bogus input
    // m_angle must never be decreasing
    m_angle.Swap();
    Reverse();
  }
  if ( m_angle.Length() > 2.0*ON_PI )
  {
    rc = false; // bogus input
    m_angle.m_t[1] = m_angle.m_t[0] + 2.0*ON_PI;
  }
  if ( rc )
    rc = IsValid();
  return rc;
}